

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall parser::memo::any::bind<hwl::Variable>(any *this,Variable *v)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  type_info *this_00;
  
  if (this->p == (dyn *)0x0) {
    this_00 = (type_info *)&void::typeinfo;
  }
  else {
    iVar2 = (*this->p->_vptr_dyn[2])();
    this_00 = (type_info *)CONCAT44(extraout_var,iVar2);
  }
  bVar1 = std::type_info::operator==(this_00,(type_info *)&hwl::Variable::typeinfo);
  if (bVar1) {
    hwl::Variable::operator=(v,(Variable *)(this->p + 1));
    return;
  }
  return;
}

Assistant:

void bind(T& v) {
				if ( type() == typeid(T) ) {
					v = static_cast<of<T>*>(p)->v;
				}
			}